

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O0

QString * __thiscall QAbstractFileEngineIterator::currentFilePath(QAbstractFileEngineIterator *this)

{
  bool bVar1;
  QString *in_RSI;
  QAbstractFileEngineIterator *in_RDI;
  long in_FS_OFFSET;
  QString name;
  QAbstractFileEngineIterator *this_00;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  (*(code *)(in_RSI->d).d[1].super_QArrayData.alloc)(&local_20);
  bVar1 = QString::isNull((QString *)0x191c55);
  if (bVar1) {
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  else {
    path(in_RDI);
    ::operator+(in_RSI,(QString *)this_00);
    ::QStringBuilder::operator_cast_to_QString((QStringBuilder<QString,_QString_&> *)in_RDI);
    QStringBuilder<QString,_QString_&>::~QStringBuilder
              ((QStringBuilder<QString,_QString_&> *)0x191cae);
    QString::~QString((QString *)0x191cb8);
  }
  QString::~QString((QString *)0x191cca);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QAbstractFileEngineIterator::currentFilePath() const
{
    QString name = currentFileName();
    if (name.isNull())
        return name;

    return path() + name;
}